

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::RemoveEdge
          (GraphCycles *this,GraphId x,GraphId y)

{
  Node **ppNVar1;
  Node *pNVar2;
  int *piVar3;
  uint32_t uVar4;
  Node *pNVar5;
  Node *pNVar6;
  
  ppNVar1 = (this->rep_->nodes_).ptr_;
  pNVar5 = ppNVar1[x.handle & 0xffffffff];
  if (pNVar5->version != (uint32_t)(x.handle >> 0x20)) {
    pNVar5 = (Node *)0x0;
  }
  pNVar2 = ppNVar1[y.handle & 0xffffffff];
  pNVar6 = (Node *)0x0;
  if (pNVar2->version == (uint32_t)(y.handle >> 0x20)) {
    pNVar6 = pNVar2;
  }
  if ((pNVar5 != (Node *)0x0) && (pNVar6 != (Node *)0x0)) {
    uVar4 = anon_unknown_0::NodeSet::FindIndex(&pNVar5->out,(int32_t)y.handle);
    piVar3 = (pNVar5->out).table_.ptr_;
    if (piVar3[uVar4] == (int32_t)y.handle) {
      piVar3[uVar4] = -2;
    }
    uVar4 = anon_unknown_0::NodeSet::FindIndex(&pNVar6->in,(int32_t)x.handle);
    piVar3 = (pNVar6->in).table_.ptr_;
    if (piVar3[uVar4] == (int32_t)x.handle) {
      piVar3[uVar4] = -2;
    }
  }
  return;
}

Assistant:

void GraphCycles::RemoveEdge(GraphId x, GraphId y) {
  Node* xn = FindNode(rep_, x);
  Node* yn = FindNode(rep_, y);
  if (xn && yn) {
    xn->out.erase(NodeIndex(y));
    yn->in.erase(NodeIndex(x));
    // No need to update the rank assignment since a previous valid
    // rank assignment remains valid after an edge deletion.
  }
}